

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O1

int aes_encrypt_key192(uchar *key,aes_encrypt_ctx *cx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar8 = *(uint *)key;
  cx->ks[0] = uVar8;
  uVar10 = *(uint *)(key + 4);
  cx->ks[1] = uVar10;
  uVar5 = *(uint *)(key + 8);
  cx->ks[2] = uVar5;
  uVar9 = *(uint *)(key + 0xc);
  cx->ks[3] = uVar9;
  uVar6 = *(uint *)(key + 0x10);
  cx->ks[4] = uVar6;
  bVar1 = key[0x17];
  bVar2 = key[0x16];
  bVar3 = key[0x15];
  bVar4 = key[0x14];
  uVar7 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18 | (uint)bVar4;
  cx->ks[5] = uVar7;
  uVar8 = t_fl[0][bVar3] ^ t_fl[1][bVar2] ^ t_fl[2][bVar1] ^ t_fl[3][bVar4] ^ 1 ^ uVar8;
  cx->ks[6] = uVar8;
  cx->ks[7] = uVar8 ^ uVar10;
  uVar5 = uVar8 ^ uVar10 ^ uVar5;
  cx->ks[8] = uVar5;
  cx->ks[9] = uVar5 ^ uVar9;
  uVar6 = uVar5 ^ uVar9 ^ uVar6;
  cx->ks[10] = uVar6;
  uVar12 = uVar6 ^ uVar7;
  cx->ks[0xb] = uVar12;
  uVar12 = *(uint *)((long)t_fl[1] + (ulong)(uVar12 >> 0xe & 0x3fc)) ^ t_fl[0][uVar12 >> 8 & 0xff] ^
           t_fl[2][uVar12 >> 0x18] ^ t_fl[3][uVar12 & 0xff] ^ 2;
  uVar8 = uVar8 ^ uVar12;
  cx->ks[0xc] = uVar8;
  uVar12 = uVar12 ^ uVar10;
  cx->ks[0xd] = uVar12;
  cx->ks[0xe] = uVar12 ^ uVar5;
  uVar10 = uVar12 ^ uVar9;
  cx->ks[0xf] = uVar10;
  cx->ks[0x10] = uVar10 ^ uVar6;
  uVar7 = uVar7 ^ uVar10;
  cx->ks[0x11] = uVar7;
  uVar8 = t_fl[0][uVar7 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar7 >> 0x18] ^ t_fl[3][uVar7 & 0xff] ^ 4 ^ uVar8;
  cx->ks[0x12] = uVar8;
  cx->ks[0x13] = uVar8 ^ uVar12;
  uVar5 = uVar5 ^ uVar8;
  cx->ks[0x14] = uVar5;
  cx->ks[0x15] = uVar10 ^ uVar5;
  uVar11 = uVar5 ^ uVar6;
  cx->ks[0x16] = uVar11;
  uVar10 = uVar11 ^ uVar7;
  cx->ks[0x17] = uVar10;
  uVar10 = *(uint *)((long)t_fl[1] + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ t_fl[0][uVar10 >> 8 & 0xff] ^
           t_fl[2][uVar10 >> 0x18] ^ t_fl[3][uVar10 & 0xff] ^ 8;
  cx->ks[0x18] = uVar8 ^ uVar10;
  uVar12 = uVar12 ^ uVar10;
  cx->ks[0x19] = uVar12;
  cx->ks[0x1a] = uVar12 ^ uVar5;
  uVar9 = uVar10 ^ uVar9;
  cx->ks[0x1b] = uVar9;
  cx->ks[0x1c] = uVar11 ^ uVar9;
  uVar11 = uVar9 ^ uVar7;
  cx->ks[0x1d] = uVar11;
  uVar8 = t_fl[0][uVar11 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar11 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar11 >> 0x18] ^ t_fl[3][uVar11 & 0xff] ^ 0x10 ^ uVar8 ^ uVar10;
  cx->ks[0x1e] = uVar8;
  cx->ks[0x1f] = uVar8 ^ uVar12;
  uVar5 = uVar5 ^ uVar8;
  cx->ks[0x20] = uVar5;
  cx->ks[0x21] = uVar5 ^ uVar9;
  uVar6 = uVar6 ^ uVar8;
  cx->ks[0x22] = uVar6;
  uVar11 = uVar11 ^ uVar6;
  cx->ks[0x23] = uVar11;
  uVar10 = *(uint *)((long)t_fl[1] + (ulong)(uVar11 >> 0xe & 0x3fc)) ^ t_fl[0][uVar11 >> 8 & 0xff] ^
           t_fl[2][uVar11 >> 0x18] ^ t_fl[3][uVar11 & 0xff] ^ 0x20;
  uVar8 = uVar8 ^ uVar10;
  cx->ks[0x24] = uVar8;
  uVar10 = uVar10 ^ uVar12;
  cx->ks[0x25] = uVar10;
  cx->ks[0x26] = uVar10 ^ uVar5;
  uVar12 = uVar10 ^ uVar9;
  cx->ks[0x27] = uVar12;
  cx->ks[0x28] = uVar12 ^ uVar6;
  uVar7 = uVar7 ^ uVar10;
  cx->ks[0x29] = uVar7;
  uVar8 = t_fl[0][uVar7 >> 8 & 0xff] ^ *(uint *)((long)t_fl[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^
          t_fl[2][uVar7 >> 0x18] ^ t_fl[3][uVar7 & 0xff] ^ 0x40 ^ uVar8;
  cx->ks[0x2a] = uVar8;
  cx->ks[0x2b] = uVar8 ^ uVar10;
  uVar5 = uVar5 ^ uVar8;
  cx->ks[0x2c] = uVar5;
  cx->ks[0x2d] = uVar12 ^ uVar5;
  cx->ks[0x2e] = uVar6 ^ uVar5;
  uVar7 = uVar6 ^ uVar5 ^ uVar7;
  cx->ks[0x2f] = uVar7;
  uVar6 = *(uint *)((long)t_fl[1] + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ t_fl[0][uVar7 >> 8 & 0xff] ^
          t_fl[2][uVar7 >> 0x18] ^ t_fl[3][uVar7 & 0xff] ^ 0x80;
  cx->ks[0x30] = uVar8 ^ uVar6;
  cx->ks[0x31] = uVar10 ^ uVar6;
  cx->ks[0x32] = uVar10 ^ uVar6 ^ uVar5;
  cx->ks[0x33] = uVar6 ^ uVar9;
  (cx->inf).l = 0;
  (cx->inf).b[0] = 0xc0;
  return 0;
}

Assistant:

AES_RETURN aes_xi(encrypt_key192)(const unsigned char *key, aes_encrypt_ctx cx[1])
{   uint32_t    ss[6];

	cx->ks[0] = ss[0] = word_in(key, 0);
    cx->ks[1] = ss[1] = word_in(key, 1);
    cx->ks[2] = ss[2] = word_in(key, 2);
    cx->ks[3] = ss[3] = word_in(key, 3);
    cx->ks[4] = ss[4] = word_in(key, 4);
    cx->ks[5] = ss[5] = word_in(key, 5);

#ifdef ENC_KS_UNROLL
    ke6(cx->ks, 0);  ke6(cx->ks, 1);
    ke6(cx->ks, 2);  ke6(cx->ks, 3);
    ke6(cx->ks, 4);  ke6(cx->ks, 5);
    ke6(cx->ks, 6);
#else
    {   uint32_t i;
        for(i = 0; i < 7; ++i)
            ke6(cx->ks, i);
    }
#endif
    kef6(cx->ks, 7);
    cx->inf.l = 0;
    cx->inf.b[0] = 12 * 16;

#ifdef USE_VIA_ACE_IF_PRESENT
    if(VIA_ACE_AVAILABLE)
        cx->inf.b[1] = 0xff;
#endif
    return EXIT_SUCCESS;
}